

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O1

QString * __thiscall
QAbstractFileEngineIterator::currentFilePath
          (QString *__return_storage_ptr__,QAbstractFileEngineIterator *this)

{
  Data *pDVar1;
  qsizetype qVar2;
  char16_t *__old_val;
  long in_FS_OFFSET;
  QStringBuilder<QString,_QString_&> local_58;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (*this->_vptr_QAbstractFileEngineIterator[3])(&local_38);
  qVar2 = local_38.d.size;
  pDVar1 = local_38.d.d;
  if (local_38.d.ptr == (char16_t *)0x0) {
    local_38.d.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    local_38.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    local_38.d.size = 0;
    (__return_storage_ptr__->d).size = qVar2;
  }
  else {
    local_58.a.d.d = (this->m_path).d.d;
    local_58.a.d.ptr = (this->m_path).d.ptr;
    local_58.a.d.size = (this->m_path).d.size;
    if (&(local_58.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_58.a.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_58.a.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.b = &local_38;
    QStringBuilder<QString,_QString_&>::convertTo<QString>(__return_storage_ptr__,&local_58);
    if (&(local_58.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAbstractFileEngineIterator::currentFilePath() const
{
    QString name = currentFileName();
    if (name.isNull())
        return name;

    return path() + name;
}